

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

ssize_t __thiscall
anon_unknown.dwarf_1c6ef40::Impl::send(Impl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  ssize_t sVar2;
  undefined8 extraout_RAX;
  void *__buf_00;
  undefined4 in_register_00000034;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  string *s_local;
  Impl *this_local;
  
  lock._12_4_ = in_register_00000034;
  lock._8_4_ = __fd;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->sendMutex);
  bVar1 = dap::ContentWriter::isOpen(&this->writer);
  if (bVar1) {
    sVar2 = dap::ContentWriter::write(&this->writer,lock._8_4_,__buf_00,__n);
    this_local._7_1_ = (byte)sVar2 & 1;
  }
  else {
    EventHandlers::error(&this->handlers,"Send failed as the writer is closed");
    this_local._7_1_ = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_);
}

Assistant:

bool send(const std::string& s) {
    std::unique_lock<std::mutex> lock(sendMutex);
    if (!writer.isOpen()) {
      handlers.error("Send failed as the writer is closed");
      return false;
    }
    return writer.write(s);
  }